

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O2

double __thiscall Assimp::StreamReader<true,_true>::Get<double>(StreamReader<true,_true> *this)

{
  double *pdVar1;
  double dVar2;
  DeadlyImportError *this_00;
  double dVar3;
  allocator<char> local_39;
  string local_38;
  
  pdVar1 = (double *)((long)this->current + 8);
  if (pdVar1 <= this->limit) {
    dVar2 = *(double *)this->current;
    dVar3 = (double)((ulong)dVar2 >> 0x38 | ((ulong)dVar2 & 0xff000000000000) >> 0x28 |
                     ((ulong)dVar2 & 0xff0000000000) >> 0x18 | ((ulong)dVar2 & 0xff00000000) >> 8 |
                     ((ulong)dVar2 & 0xff000000) << 8 | ((ulong)dVar2 & 0xff0000) << 0x18 |
                     ((ulong)dVar2 & 0xff00) << 0x28 | (long)dVar2 << 0x38);
    if (this->le != false) {
      dVar3 = dVar2;
    }
    this->current = (int8_t *)pdVar1;
    return dVar3;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"End of file or stream limit was reached",&local_39);
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T Get() {
        if ( current + sizeof(T) > limit) {
            throw DeadlyImportError("End of file or stream limit was reached");
        }

        T f;
        ::memcpy (&f, current, sizeof(T));
        Intern::Getter<SwapEndianess,T,RuntimeSwitch>() (&f,le);
        current += sizeof(T);

        return f;
    }